

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O0

VirtualIterator<unsigned_int> __thiscall Kernel::Clause::getVariableIterator(Clause *this)

{
  IteratorCore<unsigned_int> *in_RDI;
  Clause *in_stack_ffffffffffffff30;
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_Kernel::Literal_*const_&>_>,_Kernel::VariableIteratorFn,_Lib::VirtualIterator<Kernel::TermList>_>_>,_Kernel::OrdVarNumberExtractorFn,_unsigned_int>
  *it;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_Kernel::Literal_*const_&>_>,_Kernel::VariableIteratorFn,_Lib::VirtualIterator<Kernel::TermList>_>_>,_Kernel::OrdVarNumberExtractorFn,_unsigned_int>
  local_80 [2];
  
  iterLits(in_stack_ffffffffffffff30);
  it = local_80;
  Lib::
  getMapAndFlattenIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause_const&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*const&>>,Kernel::VariableIteratorFn>
            ();
  Lib::
  getMappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause_const&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*const&>>,Kernel::VariableIteratorFn,Lib::VirtualIterator<Kernel::TermList>>>,Kernel::OrdVarNumberExtractorFn>
            (&local_80[0]._inner._current.super_OptionBase<Lib::VirtualIterator<Kernel::TermList>_>.
              _elem,it);
  Lib::
  getUniquePersistentIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause_const&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*const&>>,Kernel::VariableIteratorFn,Lib::VirtualIterator<Kernel::TermList>>>,Kernel::OrdVarNumberExtractorFn,unsigned_int>>
            (it);
  Lib::pvi<Lib::VirtualIterator<unsigned_int>>((VirtualIterator<unsigned_int> *)it);
  Lib::VirtualIterator<unsigned_int>::~VirtualIterator
            ((VirtualIterator<unsigned_int> *)CONCAT44(uStack_8c,uStack_90));
  Lib::
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_Kernel::Literal_*const_&>_>,_Kernel::VariableIteratorFn,_Lib::VirtualIterator<Kernel::TermList>_>_>,_Kernel::OrdVarNumberExtractorFn,_unsigned_int>
  ::~MappingIterator((MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_Kernel::Literal_*const_&>_>,_Kernel::VariableIteratorFn,_Lib::VirtualIterator<Kernel::TermList>_>_>,_Kernel::OrdVarNumberExtractorFn,_unsigned_int>
                      *)0x842642);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_Kernel::Literal_*const_&>_>,_Kernel::VariableIteratorFn,_Lib::VirtualIterator<Kernel::TermList>_>_>
  ::~FlatteningIterator
            ((FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_Kernel::Literal_*const_&>_>,_Kernel::VariableIteratorFn,_Lib::VirtualIterator<Kernel::TermList>_>_>
              *)0x84264c);
  return (VirtualIterator<unsigned_int>)in_RDI;
}

Assistant:

VirtualIterator<unsigned> Clause::getVariableIterator() const
{
  return pvi( getUniquePersistentIterator(
      getMappingIterator(
	  getMapAndFlattenIterator(
	      iterLits(),
	      VariableIteratorFn()),
	  OrdVarNumberExtractorFn())));
}